

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

int kiss_fft_next_fast_size(int n)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar3 = n;
  do {
    do {
      uVar6 = uVar3;
      uVar1 = n & 1;
      uVar2 = (ulong)(uint)n;
      n = n >> 1;
      uVar3 = uVar6;
    } while (uVar1 == 0);
    do {
      uVar5 = uVar2;
      uVar2 = (long)(int)uVar5 / 3 & 0xffffffff;
    } while ((int)uVar5 % 3 == 0);
    do {
      iVar4 = (int)uVar5;
      uVar5 = (long)iVar4 / 5 & 0xffffffff;
    } while (iVar4 % 5 == 0);
    n = uVar6 + 1;
    uVar3 = n;
  } while (1 < iVar4);
  return uVar6;
}

Assistant:

int kiss_fft_next_fast_size(int n)
{
    while(1) {
        int m=n;
        while ( (m%2) == 0 ) m/=2;
        while ( (m%3) == 0 ) m/=3;
        while ( (m%5) == 0 ) m/=5;
        if (m<=1)
            break; /* n is completely factorable by twos, threes, and fives */
        n++;
    }
    return n;
}